

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void __thiscall
AssemblyCode::MoveRegRegCommand::MoveRegRegCommand
          (MoveRegRegCommand *this,CTemp *_target,CTemp *_source)

{
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_0017cbe0;
  std::__cxx11::string::string((string *)&this->source,(string *)_source);
  std::__cxx11::string::string((string *)&this->target,(string *)_target);
  return;
}

Assistant:

AssemblyCode::MoveRegRegCommand::MoveRegRegCommand(
        IRT::CTemp _target, IRT::CTemp _source
) : source( _source ), target( _target ) { }